

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.hpp
# Opt level: O2

void __thiscall
boost::filesystem::filesystem_error::filesystem_error
          (filesystem_error *this,string *what_arg,path *path1_arg,error_code ec)

{
  m_imp *this_00;
  type pmVar1;
  error_code ec_00;
  
  ec_00._4_4_ = 0;
  ec_00.m_val = ec.m_val;
  ec_00.m_cat = ec.m_cat;
  system::system_error::system_error(&this->super_system_error,ec_00,what_arg);
  *(undefined ***)&this->super_system_error = &PTR__filesystem_error_001189c0;
  (this->m_imp_ptr).px = (element_type *)0x0;
  (this->m_imp_ptr).pn.pi_ = (sp_counted_base *)0x0;
  this_00 = (m_imp *)operator_new(0x60);
  m_imp::m_imp(this_00);
  shared_ptr<boost::filesystem::filesystem_error::m_imp>::
  reset<boost::filesystem::filesystem_error::m_imp>(&this->m_imp_ptr,this_00);
  pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(&this->m_imp_ptr);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  return;
}

Assistant:

filesystem_error(
        const std::string & what_arg, const path& path1_arg,
        system::error_code ec) BOOST_NOEXCEPT
        : system::system_error(ec, what_arg)
      {
        try
        {
          m_imp_ptr.reset(new m_imp);
          m_imp_ptr->m_path1 = path1_arg;
        }
        catch (...) { m_imp_ptr.reset(); }
      }